

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  char *path;
  char *path_00;
  pointer pbVar6;
  string tgt;
  string replace;
  string local_118;
  cmLocalUnixMakefileGenerator3 *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  char *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  string local_80;
  string *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  local_f8 = this;
  local_88 = depends;
  local_60 = target;
  if (target->_M_string_length != 0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_58 = commands;
    if (comment != (char *)0x0) {
      strlen(comment);
      std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)comment);
      lVar2 = std::__cxx11::string::find((char)&local_80,10);
      if (lVar2 != -1) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
          std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_80);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          lVar2 = std::__cxx11::string::find((char)&local_80,10);
        } while (lVar2 != -1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_80);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)local_f8);
    std::__cxx11::string::string((string *)&local_d0,pcVar4,(allocator *)&local_b0);
    MaybeConvertToRelativePath(&local_118,local_f8,&local_d0,local_60);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_f0,(cmSystemTools *)local_118._M_dataplus._M_p,path);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_90 = "";
    if (local_f0._M_string_length == 1) {
      local_90 = " ";
    }
    if (symbolic) {
      this_00 = (local_f8->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_MAKE_SYMBOLIC_RULE","");
      pcVar4 = cmMakefile::GetDefinition(this_00,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (pcVar4 != (char *)0x0) {
        local_118._M_dataplus._M_p = local_f0._M_dataplus._M_p;
        poVar3 = operator<<(os,(cmMakeSafe *)&local_118);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_90,(ulong)(local_f0._M_string_length == 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
    }
    if ((local_88->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (local_88->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_118._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      poVar3 = operator<<(os,(cmMakeSafe *)&local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_90,(ulong)(local_f0._M_string_length == 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
    }
    else {
      pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)local_f8);
      std::__cxx11::string::string((string *)&local_118,pcVar4,(allocator *)&local_d0);
      pbVar6 = (local_88->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar6 != (local_88->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__cxx11::string::_M_assign((string *)&local_80);
          MaybeConvertToRelativePath(&local_b0,local_f8,&local_118,&local_80);
          cmSystemTools::ConvertToOutputPath_abi_cxx11_
                    (&local_d0,(cmSystemTools *)local_b0._M_dataplus._M_p,path_00);
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          local_d0._M_dataplus._M_p = local_f0._M_dataplus._M_p;
          poVar3 = operator<<(os,(cmMakeSafe *)&local_d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,local_90,(ulong)(local_f0._M_string_length == 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
          local_b0._M_dataplus._M_p = local_80._M_dataplus._M_p;
          poVar3 = operator<<(poVar3,(cmMakeSafe *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != (local_88->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\t","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\n","");
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_118,&local_d0,local_58,&local_b0,&local_50);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (symbolic) {
      bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)local_f8);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,".PHONY : ",9);
        local_118._M_dataplus._M_p = local_f0._M_dataplus._M_p;
        poVar3 = operator<<(os,(cmMakeSafe *)&local_118);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    if (in_help) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_f8->LocalHelp,local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  cmSystemTools::Error
            ("No target for WriteMakeRule! called with comment: ",comment,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    cmSystemTools::Error("No target for WriteMakeRule! called with comment: ",
                         comment);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt = cmSystemTools::ConvertToOutputPath(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), target)
      .c_str());

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (const char* sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << cmMakeSafe(tgt) << space << ": " << sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << cmMakeSafe(tgt) << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    std::string binDir = this->GetBinaryDirectory();
    for (std::vector<std::string>::const_iterator dep = depends.begin();
         dep != depends.end(); ++dep) {
      replace = *dep;
      replace = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, replace).c_str());
      os << cmMakeSafe(tgt) << space << ": " << cmMakeSafe(replace) << "\n";
    }
  }

  // Write the list of commands.
  os << cmWrap("\t", commands, "", "\n") << "\n";
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << cmMakeSafe(tgt) << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}